

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int copy_ticket(ptls_encrypt_ticket_t *self,ptls_t *tls,ptls_buffer_t *dst,ptls_iovec_t src)

{
  size_t delta;
  int ret;
  ptls_buffer_t *dst_local;
  ptls_t *tls_local;
  ptls_encrypt_ticket_t *self_local;
  ptls_iovec_t src_local;
  
  delta = src.len;
  src_local.len._4_4_ = ptls_buffer_reserve(dst,delta);
  if (src_local.len._4_4_ == 0) {
    memcpy(dst->base + dst->off,src.base,delta);
    dst->off = delta + dst->off;
    src_local.len._4_4_ = 0;
  }
  return src_local.len._4_4_;
}

Assistant:

static int copy_ticket(ptls_encrypt_ticket_t *self, ptls_t *tls, ptls_buffer_t *dst, ptls_iovec_t src)
{
    int ret;

    if ((ret = ptls_buffer_reserve(dst, src.len)) != 0)
        return ret;
    memcpy(dst->base + dst->off, src.base, src.len);
    dst->off += src.len;

    return 0;
}